

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportFileGenerator::AddTargetNamespace
          (cmExportFileGenerator *this,string *input,cmGeneratorTarget *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  cmLocalGenerator *this_00;
  cmGeneratorTarget *this_01;
  long *plVar3;
  _Base_ptr p_Var4;
  ulong *puVar5;
  _Base_ptr p_Var6;
  string namespacedTarget;
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  string local_50;
  
  this_00 = cmGeneratorTarget::GetLocalGenerator(target);
  this_01 = cmLocalGenerator::FindGeneratorTargetToUse(this_00,input);
  if ((this_01 != (cmGeneratorTarget *)0x0) &&
     (bVar2 = cmGeneratorTarget::IsImported(this_01), !bVar2)) {
    p_Var1 = &(this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = (this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var1->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0;
        p_Var6 = (&p_Var6->_M_left)[*(cmGeneratorTarget **)(p_Var6 + 1) < this_01]) {
      if (*(cmGeneratorTarget **)(p_Var6 + 1) >= this_01) {
        p_Var4 = p_Var6;
      }
    }
    p_Var6 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
       (p_Var6 = p_Var4, this_01 < *(cmGeneratorTarget **)(p_Var4 + 1))) {
      p_Var6 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      local_68 = 0;
      local_60 = local_60 & 0xffffffffffffff00;
      local_70 = &local_60;
      (*this->_vptr_cmExportFileGenerator[4])(this,&local_70,missingTargets,target,this_01);
      if (local_68 != 0) {
        std::__cxx11::string::_M_assign((string *)input);
      }
      local_50.field_2._M_allocated_capacity = local_60;
      local_50._M_dataplus._M_p = (pointer)local_70;
      if (local_70 == &local_60) goto LAB_0034b765;
    }
    else {
      cmGeneratorTarget::GetExportName_abi_cxx11_(&local_50,this_01);
      plVar3 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_50,0,(char *)0x0,
                                  (ulong)(this->Namespace)._M_dataplus._M_p);
      puVar5 = (ulong *)(plVar3 + 2);
      if ((ulong *)*plVar3 == puVar5) {
        local_60 = *puVar5;
        lStack_58 = plVar3[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar5;
        local_70 = (ulong *)*plVar3;
      }
      local_68 = plVar3[1];
      *plVar3 = (long)puVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)input,(string *)&local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0034b765;
    }
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_0034b765:
  return this_01 != (cmGeneratorTarget *)0x0;
}

Assistant:

bool
cmExportFileGenerator::AddTargetNamespace(std::string &input,
                                    cmGeneratorTarget* target,
                                    std::vector<std::string> &missingTargets)
{
  cmLocalGenerator *lg = target->GetLocalGenerator();

  cmGeneratorTarget *tgt = lg->FindGeneratorTargetToUse(input);
  if (!tgt)
    {
    return false;
    }

  if(tgt->IsImported())
    {
    return true;
    }
  if(this->ExportedTargets.find(tgt) != this->ExportedTargets.end())
    {
    input = this->Namespace + tgt->GetExportName();
    }
  else
    {
    std::string namespacedTarget;
    this->HandleMissingTarget(namespacedTarget, missingTargets,
                              target, tgt);
    if (!namespacedTarget.empty())
      {
      input = namespacedTarget;
      }
    }
  return true;
}